

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

bool __thiscall QRegularExpressionMatchIterator::hasNext(QRegularExpressionMatchIterator *this)

{
  QRegularExpressionMatchPrivate *pQVar1;
  undefined1 uVar2;
  
  pQVar1 = (((this->d).d.ptr)->next).d.d.ptr;
  if (pQVar1->isValid == true) {
    uVar2 = 1;
    if (pQVar1->hasMatch == false) {
      uVar2 = pQVar1->hasPartialMatch;
    }
    return (bool)uVar2;
  }
  return false;
}

Assistant:

constexpr P get() const noexcept { return ptr; }